

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncBufferUpdate::Cleanup(AdvancedSyncBufferUpdate *this)

{
  AdvancedSyncBufferUpdate *this_local;
  
  glu::CallLogWrapper::glDisable
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c89);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_buffer);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_buffer_tex);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_store_program);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_attribless_vao);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		glUseProgram(0);
		glDeleteBuffers(1, &m_buffer);
		glDeleteTextures(1, &m_buffer_tex);
		glDeleteProgram(m_store_program);
		glDeleteVertexArrays(1, &m_attribless_vao);
		return NO_ERROR;
	}